

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unpacked_star_expression.cpp
# Opt level: O2

void duckdb::AddChild(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *child,expression_list_t *new_children,expression_list_t *replacements,
                     StarExpression *star,optional_ptr<duckdb_re2::RE2,_true> regex)

{
  pointer puVar1;
  bool bVar2;
  type pPVar3;
  BaseExpression *pBVar4;
  OperatorExpression *pOVar5;
  pointer pPVar6;
  ColumnRefExpression *this;
  pointer pPVar7;
  string *column_name;
  pointer replacement;
  optional_ptr<duckdb::ParsedExpression,_true> expr;
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  local_80;
  optional_ptr<duckdb_re2::RE2,_true> local_78;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  *local_70;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_68;
  StarExpression *local_60;
  optional_ptr<duckdb::ParsedExpression,_true> local_58;
  string local_50;
  
  local_78.ptr = regex.ptr;
  local_60 = star;
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(child);
  bVar2 = StarExpression::IsColumnsUnpacked(pPVar3);
  if (bVar2) {
    local_70 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)new_children;
    pBVar4 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(child)->super_BaseExpression;
    pOVar5 = BaseExpression::Cast<duckdb::OperatorExpression>(pBVar4);
    local_68 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(&pOVar5->children,0);
    puVar1 = (replacements->
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (replacement = (replacements->
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; replacement != puVar1;
        replacement = replacement + 1) {
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(local_68);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_80,pPVar6);
      Binder::ReplaceStarExpression
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_80,replacement);
      bVar2 = StarExpression::IsColumns(&local_60->super_ParsedExpression);
      if (bVar2) {
        pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(replacement);
        local_58 = Binder::GetResolvedColumnExpression(pPVar3);
        if (local_58.ptr != (ParsedExpression *)0x0) {
          pBVar4 = &optional_ptr<duckdb::ParsedExpression,_true>::operator->(&local_58)->
                    super_BaseExpression;
          this = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar4);
          pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&local_80);
          if ((pPVar6->super_BaseExpression).alias._M_string_length == 0) {
            pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&local_80);
            ColumnRefExpression::GetColumnName_abi_cxx11_(this);
            ::std::__cxx11::string::_M_assign((string *)&(pPVar6->super_BaseExpression).alias);
          }
          else {
            pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&local_80);
            pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&local_80);
            column_name = ColumnRefExpression::GetColumnName_abi_cxx11_(this);
            Binder::ReplaceColumnsAlias
                      (&local_50,&(pPVar7->super_BaseExpression).alias,column_name,local_78);
            ::std::__cxx11::string::operator=
                      ((string *)&(pPVar6->super_BaseExpression).alias,(string *)&local_50);
            ::std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                (local_70,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&local_80);
      if (local_80.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
          (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_80.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                              _M_head_impl + 8))();
      }
    }
    return;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)new_children,child);
  return;
}

Assistant:

static void AddChild(unique_ptr<ParsedExpression> &child, expression_list_t &new_children,
                     expression_list_t &replacements, StarExpression &star, optional_ptr<duckdb_re2::RE2> regex) {
	if (!StarExpression::IsColumnsUnpacked(*child)) {
		// Just add the child directly
		new_children.push_back(std::move(child));
		return;
	}
	auto &unpack = child->Cast<OperatorExpression>();
	D_ASSERT(unpack.type == ExpressionType::OPERATOR_UNPACK);
	D_ASSERT(unpack.children.size() == 1);
	auto &unpack_child = unpack.children[0];

	// Replace the child with the replacement expression(s)
	for (auto &replacement : replacements) {
		auto new_expr = unpack_child->Copy();
		Binder::ReplaceStarExpression(new_expr, replacement);
		if (StarExpression::IsColumns(star)) {
			auto expr = Binder::GetResolvedColumnExpression(*replacement);
			if (expr) {
				auto &colref = expr->Cast<ColumnRefExpression>();
				if (new_expr->GetAlias().empty()) {
					new_expr->SetAlias(colref.GetColumnName());
				} else {
					new_expr->SetAlias(
					    Binder::ReplaceColumnsAlias(new_expr->GetAlias(), colref.GetColumnName(), regex));
				}
			}
		}
		new_children.push_back(std::move(new_expr));
	}
}